

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

void rw::ps2::swizzleRaster(Raster *raster)

{
  uint uVar1;
  uint32 uVar2;
  uint uVar3;
  int32 psm;
  byte local_1074;
  uint local_1070;
  uint32 local_106c;
  uint32 local_1068;
  uint32 s_1;
  uint32 a_1;
  uint8 c;
  uint32 s;
  uint32 a;
  int minh;
  int minw;
  uint8 *px;
  Ps2Raster *natras;
  int local_1030;
  int32 logw;
  int32 i;
  int32 h;
  int32 w;
  int32 y;
  int32 x;
  uint32 mask;
  uint8 tmpbuf [4096];
  Raster *raster_local;
  
  px = (uint8 *)((long)&raster->platform + (long)nativeRasterOffset);
  if ((raster->format & 0x6000U) != 0) {
    psm = 0x13;
    if ((raster->format & 0x4000U) != 0) {
      psm = 0x14;
    }
    transferMinSize(psm,(int)(char)px[0x2c],(int32 *)&a,(int32 *)&s);
    if ((int)a < raster->width) {
      local_1068 = raster->width;
    }
    else {
      local_1068 = a;
    }
    i = local_1068;
    if ((int)s < raster->height) {
      local_106c = raster->height;
    }
    else {
      local_106c = s;
    }
    logw = local_106c;
    _minh = raster->pixels;
    natras._4_4_ = 0;
    for (local_1030 = 1; local_1030 < raster->width; local_1030 = local_1030 << 1) {
      natras._4_4_ = natras._4_4_ + 1;
    }
    y = (1 << ((char)natras._4_4_ + 2U & 0x1f)) + -1;
    if (((raster->format & 0x4000U) == 0) || ((px[0x2c] & 4) == 0)) {
      if (((raster->format & 0x2000U) != 0) && ((px[0x2c] & 2) != 0)) {
        for (h = 0; h < logw; h = h + 4) {
          for (local_1030 = 0; local_1030 < 4; local_1030 = local_1030 + 1) {
            for (w = 0; w < i; w = w + 1) {
              uVar1 = (h + local_1030 << ((byte)natras._4_4_ & 0x1f)) + w;
              uVar2 = swizzle(w,h + local_1030,natras._4_4_);
              *(uint8 *)((long)&x + (ulong)(uVar2 & y)) = _minh[uVar1];
            }
          }
          memcpy(_minh + (h << ((byte)natras._4_4_ & 0x1f)),&x,(long)(i << 2));
        }
      }
    }
    else {
      for (h = 0; h < logw; h = h + 4) {
        for (local_1030 = 0; local_1030 < 4; local_1030 = local_1030 + 1) {
          for (w = 0; w < i; w = w + 1) {
            uVar1 = (h + local_1030 << ((byte)natras._4_4_ & 0x1f)) + w;
            uVar2 = swizzle(w,h + local_1030,natras._4_4_);
            uVar3 = uVar2 & y;
            if ((uVar1 & 1) == 0) {
              local_1070 = _minh[uVar1 >> 1] & 0xf;
            }
            else {
              local_1070 = (int)(uint)_minh[uVar1 >> 1] >> 4;
            }
            if ((uVar3 & 1) == 0) {
              local_1074 = *(byte *)((long)&x + (ulong)(uVar3 >> 1)) & 0xf0 | (byte)local_1070;
            }
            else {
              local_1074 = *(byte *)((long)&x + (ulong)(uVar3 >> 1)) & 0xf | (byte)(local_1070 << 4)
              ;
            }
            *(byte *)((long)&x + (ulong)(uVar3 >> 1)) = local_1074;
          }
        }
        memcpy(_minh + (h << ((char)natras._4_4_ - 1U & 0x1f)),&x,(long)(i << 1));
      }
    }
  }
  return;
}

Assistant:

void
swizzleRaster(Raster *raster)
{
	uint8 tmpbuf[1024*4];	// 1024x4px, maximum possible width
	uint32 mask;
	int32 x, y, w, h;
	int32 i;
	int32 logw;
	Ps2Raster *natras = GETPS2RASTEREXT(raster);
	uint8 *px;

	if((raster->format & (Raster::PAL4|Raster::PAL8)) == 0)
		return;

	int minw, minh;
	transferMinSize(raster->format & Raster::PAL4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
	w = max(raster->width, minw);
	h = max(raster->height, minh);
	px = raster->pixels;
	logw = 0;
	for(i = 1; i < raster->width; i *= 2) logw++;
	mask = (1<<(logw+2))-1;

	if(raster->format & Raster::PAL4 && natras->flags & Ps2Raster::SWIZZLED4){
		for(y = 0; y < h; y += 4){
			for(i = 0; i < 4; i++)
				for(x = 0; x < w; x++){
					uint32 a = ((y+i)<<logw)+x;
					uint32 s = swizzle(x, y+i, logw)&mask;
					uint8 c = a & 1 ? px[a>>1] >> 4 : px[a>>1] & 0xF;
					tmpbuf[s>>1] = s & 1 ? (tmpbuf[s>>1]&0xF) | c<<4 : (tmpbuf[s>>1]&0xF0) | c;
				}
			memcpy(&px[y<<(logw-1)], tmpbuf, 2*w);
		}
	}else if(raster->format & Raster::PAL8 && natras->flags & Ps2Raster::SWIZZLED8){
		for(y = 0; y < h; y += 4){
			for(i = 0; i < 4; i++)
				for(x = 0; x < w; x++){
					uint32 a = ((y+i)<<logw)+x;
					uint32 s = swizzle(x, y+i, logw)&mask;
					tmpbuf[s] = px[a];
				}
			memcpy(&px[y<<logw], tmpbuf, 4*w);
		}
	}
}